

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretrain.cc
# Opt level: O3

void dynet::save_pretrained_embeddings(string *fname,Dict *d,LookupParameter *lp)

{
  ostream *poVar1;
  LookupParameterStorage *pLVar2;
  string *psVar3;
  invalid_argument *this;
  ulong uVar4;
  long lVar5;
  ostringstream oss;
  ofstream out;
  int local_3cc;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_3c8;
  PointerType local_3a8;
  long lStack_3a0;
  long local_398;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Writing word vectors to ",0x18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(fname->_M_dataplus)._M_p,fname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ...\n",5);
  std::ofstream::ofstream(&local_230,(string *)fname,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    pLVar2 = LookupParameter::get_storage(lp);
    if ((int)((ulong)((long)(d->words_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(d->words_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        local_3cc = (int)uVar4;
        psVar3 = Dict::convert_abi_cxx11_(d,&local_3cc);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(psVar3->_M_dataplus)._M_p,
                            psVar3->_M_string_length);
        local_3a8 = (PointerType)CONCAT71(local_3a8._1_7_,0x20);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_3a8,1);
        Tensor::operator*(&local_3c8,
                          (Tensor *)
                          ((long)(((pLVar2->values).
                                   super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->d).d + lVar5));
        local_398 = local_3c8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value;
        local_3a8 = local_3c8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
        lStack_3a0 = local_3c8.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value;
        poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                           *)&local_3a8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < ((ulong)((long)(d->words_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(d->words_).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff));
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3a8,"Could not save embeddings to ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3a8,(fname->_M_dataplus)._M_p,fname->_M_string_length);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,(string *)&local_3c8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void save_pretrained_embeddings(const std::string& fname,
    const Dict& d,
    const LookupParameter& lp) {
  cerr << "Writing word vectors to " << fname << " ...\n";
  ofstream out(fname);
  if(!out)
    DYNET_INVALID_ARG("Could not save embeddings to " << fname);
  auto& m = lp.get_storage();
  for (unsigned i = 0; i < d.size(); ++i) {
    out << d.convert(i) << ' ' << (*m.values[i]).transpose() << endl;
  }
}